

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Uint64 Diligent::GetStagingTextureLocationOffset
                 (TextureDesc *TexDesc,Uint32 ArraySlice,Uint32 MipLevel,Uint32 Alignment,
                 Uint32 LocationX,Uint32 LocationY,Uint32 LocationZ)

{
  RESOURCE_DIMENSION RVar1;
  type tVar2;
  TextureFormatAttribs *pTVar3;
  undefined4 in_register_0000000c;
  char (*Args_1) [135];
  Uint32 mip;
  uint uVar4;
  ulong uVar5;
  Uint32 mip_1;
  Uint32 UVar6;
  Uint64 UVar7;
  bool bVar8;
  string msg;
  unsigned_long local_58;
  string msg_3;
  
  Args_1 = (char (*) [135])CONCAT44(in_register_0000000c,Alignment);
  if (TexDesc->MipLevels != 0) {
    RVar1 = TexDesc->Type;
    Args_1 = (char (*) [135])0x0;
    if ((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
      Args_1 = (char (*) [135])(ulong)((TexDesc->field_3).ArraySize == 0);
    }
    if (((((char)Args_1 == '\0') && (TexDesc->Width != 0)) && (TexDesc->Height != 0)) &&
       (TexDesc->Format != TEX_FORMAT_UNKNOWN)) goto LAB_0046c27c;
  }
  FormatString<char[26],char[135]>
            (&msg,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])
             "TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN"
             ,Args_1);
  DebugAssertionFailed
            ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
             "GetStagingTextureLocationOffset",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
             ,0x93b);
  std::__cxx11::string::~string((string *)&msg);
  RVar1 = TexDesc->Type;
LAB_0046c27c:
  uVar4 = 1;
  if ((RVar1 < RESOURCE_DIM_NUM_DIMENSIONS) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
    uVar4 = (TexDesc->field_3).ArraySize;
  }
  if ((uVar4 <= ArraySlice) || (TexDesc->MipLevels <= MipLevel)) {
    UVar6 = 1;
    if ((RVar1 < RESOURCE_DIM_NUM_DIMENSIONS) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
      UVar6 = (TexDesc->field_3).ArraySize;
    }
    if ((MipLevel != 0) || (UVar6 != ArraySlice)) {
      FormatString<char[26],char[125]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0"
                 ,(char (*) [125])(ulong)RVar1);
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                 "GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x93c);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  uVar4 = 0;
  if (ArraySlice == 0) {
    UVar7 = 0;
  }
  else {
    UVar7 = 0;
    for (; uVar4 < TexDesc->MipLevels; uVar4 = uVar4 + 1) {
      GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,uVar4);
      tVar2 = AlignUp<unsigned_long,unsigned_int>(local_58,Alignment);
      UVar7 = UVar7 + tVar2;
    }
    if ((TexDesc->Type < 9) && ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0)) {
      UVar7 = UVar7 * ArraySlice;
    }
  }
  for (UVar6 = 0; MipLevel != UVar6; UVar6 = UVar6 + 1) {
    GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,UVar6);
    tVar2 = AlignUp<unsigned_long,unsigned_int>(local_58,Alignment);
    UVar7 = UVar7 + tVar2;
  }
  UVar6 = 1;
  if ((TexDesc->Type < 9) && ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0)) {
    UVar6 = (TexDesc->field_3).ArraySize;
  }
  if (UVar6 == ArraySlice) {
    if ((LocationY != 0 || LocationX != 0) || LocationZ != 0) {
      FormatString<char[60]>
                (&msg,(char (*) [60])"Staging buffer size is requested: location must be (0,0,0).");
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                 "GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x956);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  else if ((LocationY != 0 || LocationX != 0) || LocationZ != 0) {
    GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,MipLevel);
    pTVar3 = GetTextureFormatAttribs(TexDesc->Format);
    if ((((uint)msg._M_dataplus._M_p <= LocationX) || (msg._M_dataplus._M_p._4_4_ <= LocationY)) ||
       ((uint)msg.field_2._M_allocated_capacity._0_4_ <= LocationZ)) {
      FormatString<char[36]>(&msg_3,(char (*) [36])"Specified location is out of bounds");
      DebugAssertionFailed
                (msg_3._M_dataplus._M_p,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x95d);
      std::__cxx11::string::~string((string *)&msg_3);
    }
    if (pTVar3->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      if ((LocationX % (uint)pTVar3->BlockWidth == 0) &&
         (LocationY % (uint)pTVar3->BlockHeight == 0)) {
        bVar8 = true;
      }
      else {
        FormatString<char[86]>
                  (&msg_3,(char (*) [86])
                          "For compressed texture formats, location must be a multiple of compressed block size."
                  );
        DebugAssertionFailed
                  (msg_3._M_dataplus._M_p,"GetStagingTextureLocationOffset",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0x961);
        std::__cxx11::string::~string((string *)&msg_3);
        bVar8 = pTVar3->ComponentType == COMPONENT_TYPE_COMPRESSED;
      }
    }
    else {
      bVar8 = false;
    }
    uVar5 = 1;
    if (!bVar8) {
      uVar5 = (ulong)pTVar3->NumComponents;
    }
    UVar7 = UVar7 + uVar5 * pTVar3->ComponentSize * ((ulong)LocationX / (ulong)pTVar3->BlockWidth) +
            ((ulong)(LocationZ * msg._M_string_length._4_4_ + LocationY) /
            (ulong)pTVar3->BlockHeight) * msg.field_2._8_8_;
  }
  return UVar7;
}

Assistant:

Uint64 GetStagingTextureLocationOffset(const TextureDesc& TexDesc,
                                       Uint32             ArraySlice,
                                       Uint32             MipLevel,
                                       Uint32             Alignment,
                                       Uint32             LocationX,
                                       Uint32             LocationY,
                                       Uint32             LocationZ)
{
    VERIFY_EXPR(TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN);
    VERIFY_EXPR(ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0);

    Uint64 Offset = 0;
    if (ArraySlice > 0)
    {
        Uint64 ArraySliceSize = 0;
        for (Uint32 mip = 0; mip < TexDesc.MipLevels; ++mip)
        {
            MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
            ArraySliceSize += AlignUp(MipInfo.MipSize, Alignment);
        }

        Offset = ArraySliceSize;
        if (TexDesc.IsArray())
            Offset *= ArraySlice;
    }

    for (Uint32 mip = 0; mip < MipLevel; ++mip)
    {
        MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
        Offset += AlignUp(MipInfo.MipSize, Alignment);
    }

    if (ArraySlice == TexDesc.GetArraySize())
    {
        VERIFY(LocationX == 0 && LocationY == 0 && LocationZ == 0,
               "Staging buffer size is requested: location must be (0,0,0).");
    }
    else if (LocationX != 0 || LocationY != 0 || LocationZ != 0)
    {
        const MipLevelProperties&   MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
        VERIFY(LocationX < MipLevelAttribs.LogicalWidth && LocationY < MipLevelAttribs.LogicalHeight && LocationZ < MipLevelAttribs.Depth,
               "Specified location is out of bounds");
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            VERIFY((LocationX % FmtAttribs.BlockWidth) == 0 && (LocationY % FmtAttribs.BlockHeight) == 0,
                   "For compressed texture formats, location must be a multiple of compressed block size.");
        }

        // For compressed-block formats, RowSize is the size of one compressed row.
        // For non-compressed formats, BlockHeight is 1.
        Offset += (LocationZ * MipLevelAttribs.StorageHeight + LocationY) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize;

        // For non-compressed formats, BlockWidth is 1.
        Offset += Uint64{LocationX / FmtAttribs.BlockWidth} * FmtAttribs.GetElementSize();

        // Note: this addressing complies with how Vulkan (as well as OpenGL/GLES and Metal) address
        // textures when copying data to/from buffers:
        //      address of (x,y,z) = bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
    }

    return Offset;
}